

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gif.h
# Opt level: O1

void GifPartitionByMedian(uint8_t *image,int left,int right,int com,int neededCenter)

{
  int right_00;
  
  while( true ) {
    if (right + -1 <= left) {
      return;
    }
    right_00 = GifPartition(image,left,right,com,(right - left) / 2 + left);
    if (neededCenter < right_00) {
      GifPartitionByMedian(image,left,right_00,com,neededCenter);
    }
    if (neededCenter <= right_00) break;
    left = right_00 + 1;
  }
  return;
}

Assistant:

void GifPartitionByMedian(uint8_t* image, int left, int right, int com, int neededCenter)
{
    if(left < right-1)
    {
        int pivotIndex = left + (right-left)/2;

        pivotIndex = GifPartition(image, left, right, com, pivotIndex);

        // Only "sort" the section of the array that contains the median
        if(pivotIndex > neededCenter)
            GifPartitionByMedian(image, left, pivotIndex, com, neededCenter);

        if(pivotIndex < neededCenter)
            GifPartitionByMedian(image, pivotIndex+1, right, com, neededCenter);
    }
}